

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gates.cpp
# Opt level: O3

void __thiscall
CaDiCaL::Internal::find_if_then_else(Internal *this,Eliminator *eliminator,int pivot)

{
  pointer *pppCVar1;
  int64_t *piVar2;
  pointer pvVar3;
  Clause *d;
  int iVar4;
  int iVar5;
  int iVar6;
  Internal *pIVar7;
  int a;
  vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *this_00;
  Eliminator *pEVar8;
  bool bVar9;
  uint uVar10;
  int b;
  Clause *pCVar12;
  iterator iVar13;
  int iVar14;
  pointer ppCVar15;
  int bi;
  Clause *d2;
  Clause *d1;
  Clause *dj;
  Clause *di;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  Internal *local_a8;
  Clause *local_a0;
  pointer local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *local_70;
  pointer local_68;
  Eliminator *local_60;
  Clause *local_58;
  Clause *local_50;
  Clause *local_48;
  Clause *local_40;
  Clause *local_38;
  int iVar11;
  
  if (((((this->opts).elimites != 0) && (this->unsat == false)) && (this->vals[pivot] == '\0')) &&
     ((eliminator->gates).super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (eliminator->gates).super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
      _M_impl.super__Vector_impl_data._M_finish)) {
    local_8c = -pivot;
    iVar11 = pivot;
    if (pivot < 1) {
      iVar11 = local_8c;
    }
    uVar10 = iVar11 << 1 | (uint)pivot >> 0x1f;
    pvVar3 = (this->otab).
             super__Vector_base<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>,_std::allocator<std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_68 = pvVar3[uVar10].
               super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_98 = *(pointer *)
                ((long)&pvVar3[uVar10].
                        super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                        _M_impl.super__Vector_impl_data + 8);
    if (local_68 != local_98) {
      local_70 = (vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>> *)&eliminator->gates;
      local_b0 = pivot;
      local_a8 = this;
      local_60 = eliminator;
      do {
        local_58 = *local_68;
        local_38 = local_58;
        bVar9 = get_ternary_clause(this,local_58,&local_b4,&local_ac,&local_74);
        if (bVar9) {
          if (local_ac == pivot) {
            local_ac = local_b4;
            local_b4 = pivot;
          }
          iVar11 = local_ac;
          ppCVar15 = local_68 + 1;
          if (ppCVar15 != local_98) {
            local_80 = local_74;
            if (local_74 == pivot) {
              local_80 = local_b4;
            }
            local_84 = -local_ac;
            if (0 < local_ac) {
              local_84 = local_ac;
            }
            local_88 = -local_80;
            if (local_80 < 1) {
              local_80 = local_88;
            }
            do {
              d = *ppCVar15;
              local_40 = d;
              bVar9 = get_ternary_clause(this,d,&local_b8,&local_78,&local_7c);
              a = local_8c;
              if (bVar9) {
                b = local_78;
                if (local_78 == pivot) {
                  b = local_b8;
                  local_b8 = pivot;
                }
                iVar14 = local_7c;
                if (local_7c == pivot) {
                  iVar14 = local_b8;
                }
                iVar4 = -iVar14;
                if (0 < iVar14) {
                  iVar4 = iVar14;
                }
                iVar5 = -b;
                if (0 < b) {
                  iVar5 = b;
                }
                iVar6 = iVar14;
                if (local_84 == iVar4) {
                  iVar6 = b;
                  iVar4 = iVar5;
                  b = iVar14;
                }
                if (((local_80 != iVar4) && (iVar11 == -b)) &&
                   (local_48 = find_ternary_clause(this,local_8c,iVar11,local_88), pivot = local_b0,
                   local_48 != (Clause *)0x0)) {
                  local_a0 = local_48;
                  pCVar12 = find_ternary_clause(this,a,b,-iVar6);
                  pEVar8 = local_60;
                  this_00 = local_70;
                  if (pCVar12 != (Clause *)0x0) {
                    local_58->field_0x8 = local_58->field_0x8 | 0x20;
                    d->field_0x8 = d->field_0x8 | 0x20;
                    local_a0->field_0x8 = local_a0->field_0x8 | 0x20;
                    pCVar12->field_0x8 = pCVar12->field_0x8 | 0x20;
                    iVar13._M_current =
                         (local_60->gates).
                         super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                    local_50 = pCVar12;
                    if (iVar13._M_current ==
                        (local_60->gates).
                        super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                      _M_realloc_insert<CaDiCaL::Clause*const&>(local_70,iVar13,&local_38);
                      iVar13._M_current =
                           (pEVar8->gates).
                           super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    else {
                      *iVar13._M_current = local_58;
                      iVar13._M_current =
                           (local_60->gates).
                           super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                      (local_60->gates).
                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish = iVar13._M_current;
                    }
                    pIVar7 = local_a8;
                    if (iVar13._M_current ==
                        (pEVar8->gates).
                        super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                      _M_realloc_insert<CaDiCaL::Clause*const&>(this_00,iVar13,&local_40);
                      iVar13._M_current =
                           (pEVar8->gates).
                           super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    else {
                      *iVar13._M_current = d;
                      iVar13._M_current =
                           (pEVar8->gates).
                           super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                      (pEVar8->gates).
                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish = iVar13._M_current;
                    }
                    if (iVar13._M_current ==
                        (pEVar8->gates).
                        super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                      _M_realloc_insert<CaDiCaL::Clause*const&>(this_00,iVar13,&local_48);
                      iVar13._M_current =
                           (pEVar8->gates).
                           super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    else {
                      *iVar13._M_current = local_a0;
                      iVar13._M_current =
                           (pEVar8->gates).
                           super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish + 1;
                      (pEVar8->gates).
                      super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish = iVar13._M_current;
                    }
                    if (iVar13._M_current ==
                        (pEVar8->gates).
                        super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>::
                      _M_realloc_insert<CaDiCaL::Clause*const&>(this_00,iVar13,&local_50);
                    }
                    else {
                      *iVar13._M_current = pCVar12;
                      pppCVar1 = &(pEVar8->gates).
                                  super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish;
                      *pppCVar1 = *pppCVar1 + 1;
                    }
                    piVar2 = &(pIVar7->stats).elimgates;
                    *piVar2 = *piVar2 + 1;
                    piVar2 = &(pIVar7->stats).elimites;
                    *piVar2 = *piVar2 + 1;
                    return;
                  }
                  local_50 = (Clause *)0x0;
                  this = local_a8;
                  pivot = local_b0;
                }
              }
              ppCVar15 = ppCVar15 + 1;
            } while (ppCVar15 != local_98);
          }
        }
        local_68 = local_68 + 1;
      } while (local_68 != local_98);
    }
  }
  return;
}

Assistant:

void Internal::find_if_then_else (Eliminator &eliminator, int pivot) {

  if (!opts.elimites)
    return;

  assert (opts.elimsubst);

  if (unsat)
    return;
  if (val (pivot))
    return;
  if (!eliminator.gates.empty ())
    return;

  const Occs &os = occs (pivot);
  const auto end = os.end ();
  for (auto i = os.begin (); i != end; i++) {
    Clause *di = *i;
    int ai, bi, ci;
    if (!get_ternary_clause (di, ai, bi, ci))
      continue;
    if (bi == pivot)
      swap (ai, bi);
    if (ci == pivot)
      swap (ai, ci);
    assert (ai == pivot);
    for (auto j = i + 1; j != end; j++) {
      Clause *dj = *j;
      int aj, bj, cj;
      if (!get_ternary_clause (dj, aj, bj, cj))
        continue;
      if (bj == pivot)
        swap (aj, bj);
      if (cj == pivot)
        swap (aj, cj);
      assert (aj == pivot);
      if (abs (bi) == abs (cj))
        swap (bj, cj);
      if (abs (ci) == abs (cj))
        continue;
      if (bi != -bj)
        continue;
      Clause *d1 = find_ternary_clause (-pivot, bi, -ci);
      if (!d1)
        continue;
      Clause *d2 = find_ternary_clause (-pivot, bj, -cj);
      if (!d2)
        continue;
      LOG (di, "1st if-then-else");
      LOG (dj, "2nd if-then-else");
      LOG (d1, "3rd if-then-else");
      LOG (d2, "4th if-then-else");
      LOG ("found ITE gate %d == (%d ? %d : %d)", pivot, -bi, -ci, -cj);
      assert (!di->gate);
      assert (!dj->gate);
      assert (!d1->gate);
      assert (!d2->gate);
      di->gate = true;
      dj->gate = true;
      d1->gate = true;
      d2->gate = true;
      eliminator.gates.push_back (di);
      eliminator.gates.push_back (dj);
      eliminator.gates.push_back (d1);
      eliminator.gates.push_back (d2);
      stats.elimgates++;
      stats.elimites++;
      return;
    }
  }
}